

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDup.c
# Opt level: O3

Aig_Man_t * Saig_ManDupWithPhase(Aig_Man_t *pAig,Vec_Int_t *vInit)

{
  ulong *puVar1;
  char *__s;
  void *pvVar2;
  int iVar3;
  Aig_Man_t *p;
  size_t sVar4;
  char *__dest;
  Aig_Obj_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  ulong uVar7;
  ulong uVar8;
  Aig_Obj_t *p1;
  long lVar9;
  
  if (vInit->nSize < pAig->nRegs) {
    __assert_fail("Aig_ManRegNum(pAig) <= Vec_IntSize(vInit)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigDup.c"
                  ,0x1e7,"Aig_Man_t *Saig_ManDupWithPhase(Aig_Man_t *, Vec_Int_t *)");
  }
  p = Aig_ManStart(pAig->nObjs[6] + pAig->nObjs[5]);
  __s = pAig->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar4 = strlen(__s);
    __dest = (char *)malloc(sVar4 + 1);
    strcpy(__dest,__s);
  }
  p->pName = __dest;
  p->nConstrs = pAig->nConstrs;
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  pVVar6 = pAig->vCis;
  if (0 < pVVar6->nSize) {
    lVar9 = 0;
    do {
      pvVar2 = pVVar6->pArray[lVar9];
      pAVar5 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar5;
      lVar9 = lVar9 + 1;
      pVVar6 = pAig->vCis;
    } while (lVar9 < pVVar6->nSize);
  }
  if (0 < pAig->nRegs) {
    lVar9 = 0;
    do {
      uVar8 = (ulong)(uint)pAig->nTruePis + lVar9;
      iVar3 = (int)uVar8;
      if ((iVar3 < 0) || (pAig->vCis->nSize <= iVar3)) goto LAB_006e2425;
      if (vInit->nSize <= lVar9) goto LAB_006e2463;
      puVar1 = (ulong *)((long)pAig->vCis->pArray[uVar8 & 0xffffffff] + 0x28);
      *puVar1 = *puVar1 ^ (long)vInit->pArray[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar9 < pAig->nRegs);
  }
  pVVar6 = pAig->vObjs;
  if (0 < pVVar6->nSize) {
    lVar9 = 0;
    do {
      pvVar2 = pVVar6->pArray[lVar9];
      if ((pvVar2 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar2 & 1) != 0) goto LAB_006e2444;
        uVar8 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
        if (uVar8 == 0) {
          pAVar5 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar5 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^ *(ulong *)(uVar8 + 0x28));
        }
        uVar8 = *(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe;
        if (uVar8 == 0) {
          p1 = (Aig_Obj_t *)0x0;
        }
        else {
          p1 = (Aig_Obj_t *)
               ((ulong)((uint)*(ulong *)((long)pvVar2 + 0x10) & 1) ^ *(ulong *)(uVar8 + 0x28));
        }
        pAVar5 = Aig_And(p,pAVar5,p1);
        *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar5;
        pVVar6 = pAig->vObjs;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < pVVar6->nSize);
  }
  if (0 < pAig->nTruePos) {
    lVar9 = 0;
    do {
      if (pAig->vCos->nSize <= lVar9) goto LAB_006e2425;
      pvVar2 = pAig->vCos->pArray[lVar9];
      if (((ulong)pvVar2 & 1) != 0) goto LAB_006e2444;
      uVar8 = *(ulong *)((long)pvVar2 + 8);
      uVar7 = uVar8 & 0xfffffffffffffffe;
      if (uVar7 == 0) {
        pAVar5 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar5 = (Aig_Obj_t *)((ulong)((uint)uVar8 & 1) ^ *(ulong *)(uVar7 + 0x28));
      }
      Aig_ObjCreateCo(p,pAVar5);
      lVar9 = lVar9 + 1;
    } while (lVar9 < pAig->nTruePos);
  }
  if (0 < pAig->nRegs) {
    lVar9 = 0;
    do {
      uVar8 = (ulong)(uint)pAig->nTruePos + lVar9;
      iVar3 = (int)uVar8;
      if ((iVar3 < 0) || (pAig->vCos->nSize <= iVar3)) {
LAB_006e2425:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = pAig->vCos->pArray[uVar8 & 0xffffffff];
      if (((ulong)pvVar2 & 1) != 0) {
LAB_006e2444:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar8 = *(ulong *)((long)pvVar2 + 8);
      uVar7 = uVar8 & 0xfffffffffffffffe;
      if (uVar7 == 0) {
        uVar8 = 0;
      }
      else {
        uVar8 = (ulong)((uint)uVar8 & 1) ^ *(ulong *)(uVar7 + 0x28);
      }
      if (vInit->nSize <= lVar9) {
LAB_006e2463:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Aig_ObjCreateCo(p,(Aig_Obj_t *)(uVar8 ^ (long)vInit->pArray[lVar9]));
      lVar9 = lVar9 + 1;
    } while (lVar9 < pAig->nRegs);
  }
  Aig_ManCleanup(p);
  Aig_ManSetRegNum(p,pAig->nRegs);
  return p;
}

Assistant:

Aig_Man_t * Saig_ManDupWithPhase( Aig_Man_t * pAig, Vec_Int_t * vInit )
{
    Aig_Man_t * pAigNew;
    Aig_Obj_t * pObj;
    int i;
    assert( Aig_ManRegNum(pAig) <= Vec_IntSize(vInit) );
    // start the new manager
    pAigNew = Aig_ManStart( Aig_ManNodeNum(pAig) );
    pAigNew->pName = Abc_UtilStrsav( pAig->pName );
    pAigNew->nConstrs = pAig->nConstrs;
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pAigNew );
    // create variables for PIs
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pAigNew );
    // update the flop variables
    Saig_ManForEachLo( pAig, pObj, i )
        pObj->pData = Aig_NotCond( (Aig_Obj_t *)pObj->pData, Vec_IntEntry(vInit, i) );
    // add internal nodes of this frame
    Aig_ManForEachNode( pAig, pObj, i )
        pObj->pData = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // transfer to register outputs
    Saig_ManForEachPo( pAig, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj) );
    // update the flop variables
    Saig_ManForEachLi( pAig, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_NotCond(Aig_ObjChild0Copy(pObj), Vec_IntEntry(vInit, i)) );
    // finalize
    Aig_ManCleanup( pAigNew );
    Aig_ManSetRegNum( pAigNew, Aig_ManRegNum(pAig) );
    return pAigNew;
}